

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void Int2StrConvert<unsigned_int>(void)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  uint i;
  uint x;
  char local_68 [8];
  char buf [64];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  pcVar6 = ___gxx_personality_v0 + (*___gxx_personality_v0 == '*');
  sVar2 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"int2str::convert",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  x = 0;
  lVar3 = std::chrono::_V2::steady_clock::now();
  do {
    pcVar6 = int2str::impl::convert_from<unsigned_char,unsigned_int,char*>(x,local_68);
    *pcVar6 = '\0';
    x = x + 1;
  } while (x != 0xffffffff);
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void Int2StrConvert()
{
#ifdef _MSC_VER  
    static char buf[64];
#else
    char buf[64];
#endif
    PROFILING_BEGIN(T, "int2str::convert")
    int2str::convert_with_zero(i, buf);
    PROFILING_END()
}